

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::write_hex_digit(string *out,uint num)

{
  char *pcVar1;
  char *pcVar2;
  Text local_50;
  Text user_msg;
  Text fail_info;
  Text local_30;
  Text str_right;
  Text str_left;
  uint local_18;
  uint val_right;
  uint val_left;
  uint num_local;
  string *out_local;
  
  str_left._str._4_4_ = 0x10;
  local_18 = num;
  val_right = num;
  _val_left = out;
  if (0xf < num) {
    format_value<unsigned_int>((loguru *)&str_right,&local_18);
    format_value<unsigned_int>((loguru *)&local_30,(uint *)((long)&str_left._str + 4));
    pcVar1 = Text::c_str(&str_right);
    pcVar2 = Text::c_str(&local_30);
    textprintf((char *)&user_msg,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","num","<","16u",pcVar1,"<",
               pcVar2);
    textprintf();
    pcVar1 = Text::c_str(&user_msg);
    pcVar2 = Text::c_str(&local_50);
    log_and_abort(0,pcVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x1f5,"%s",pcVar2);
  }
  if (num < 10) {
    std::__cxx11::string::push_back((char)out);
  }
  else {
    std::__cxx11::string::push_back((char)out);
  }
  return;
}

Assistant:

static void write_hex_digit(std::string& out, unsigned num)
	{
		DCHECK_LT_F(num, 16u);
		if (num < 10u) { out.push_back(char('0' + num)); }
		else { out.push_back(char('A' + num - 10)); }
	}